

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TlsDirWrapper.cpp
# Opt level: O0

addr_type __thiscall
TlsDirWrapper::containsAddrType(TlsDirWrapper *this,size_t fieldId,size_t subField)

{
  size_t subField_local;
  size_t fieldId_local;
  TlsDirWrapper *this_local;
  
  if (fieldId < 4) {
    this_local._4_4_ = VA;
  }
  else {
    this_local._4_4_ = NOT_ADDR;
  }
  return this_local._4_4_;
}

Assistant:

Executable::addr_type TlsDirWrapper::containsAddrType(size_t fieldId, size_t subField)
{
    switch (fieldId) {
        case START_ADDR :
        case END_ADDR :
        case INDEX_ADDR :
        case CALLBACKS_ADDR :
            return Executable::VA;
    }
    return Executable::NOT_ADDR;
}